

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdx86_decoder.c
# Opt level: O0

NDSTATUS NdFetchAddressFar(INSTRUX *Instrux,ND_UINT8 *Code,ND_UINT8 Offset,ND_SIZET Size,
                          ND_UINT8 AddressSize)

{
  ND_UINT64 NVar1;
  ND_UINT8 AddressSize_local;
  ND_SIZET Size_local;
  ND_UINT8 Offset_local;
  ND_UINT8 *Code_local;
  INSTRUX *Instrux_local;
  
  if (Size < (ulong)Offset + (ulong)AddressSize) {
    Instrux_local._4_4_ = 0x80000001;
  }
  else {
    *(uint *)&Instrux->field_0x5 = *(uint *)&Instrux->field_0x5 & 0xffffbfff | 0x4000;
    *(ulong *)&Instrux->field_0xc =
         *(ulong *)&Instrux->field_0xc & 0xffffffffff0fffff | ((ulong)AddressSize & 0xf) << 0x14;
    *(ulong *)&Instrux->field_0xc =
         *(ulong *)&Instrux->field_0xc & 0xff0fffffffffffff | ((ulong)Offset & 0xf) << 0x34;
    NVar1 = NdFetchData(Code + (int)(uint)Offset,
                        ((byte)(*(ulong *)&Instrux->field_0xc >> 0x14) & 0xf) - 2);
    (Instrux->field_74).Displacement = (ND_UINT32)NVar1;
    NVar1 = NdFetchData(Code + (long)(int)(uint)((byte)(*(ulong *)&Instrux->field_0xc >> 0x14) & 0xf
                                                ) + (long)(int)(uint)Offset + -2,'\x02');
    (Instrux->field_74).Address.Cs = (ND_UINT16)NVar1;
    Instrux->Length = Instrux->Length + ((byte)(*(ulong *)&Instrux->field_0xc >> 0x14) & 0xf);
    if (Instrux->Length < 0x10) {
      Instrux_local._4_4_ = 0;
    }
    else {
      Instrux_local._4_4_ = 0x80000003;
    }
  }
  return Instrux_local._4_4_;
}

Assistant:

static NDSTATUS
NdFetchAddressFar(
    INSTRUX *Instrux,
    const ND_UINT8 *Code,
    ND_UINT8 Offset,
    ND_SIZET Size,
    ND_UINT8 AddressSize
    )
{
    RET_GT((ND_SIZET)Offset + AddressSize, Size, ND_STATUS_BUFFER_TOO_SMALL);

    Instrux->HasAddr = ND_TRUE;
    Instrux->AddrLength = AddressSize;
    Instrux->AddrOffset = Offset;

    Instrux->Address.Ip = (ND_UINT32)NdFetchData(Code + Offset, Instrux->AddrLength - 2);
    Instrux->Address.Cs = (ND_UINT16)NdFetchData(Code + Offset + Instrux->AddrLength - 2, 2);

    Instrux->Length += Instrux->AddrLength;
    if (Instrux->Length > ND_MAX_INSTRUCTION_LENGTH)
    {
        return ND_STATUS_INSTRUCTION_TOO_LONG;
    }

    return ND_STATUS_SUCCESS;
}